

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O1

void QtSharedPointer::internalSafetyCheckRemove(void *d_ptr)

{
  Entry *pEVar1;
  __pointer_type copy;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  Span *pSVar5;
  Entry *pEVar6;
  Entry *pEVar7;
  undefined8 uVar8;
  Type *this;
  ulong uVar9;
  undefined8 extraout_RAX;
  ulong uVar10;
  Span *pSVar11;
  Span *pSVar12;
  Span *pSVar13;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RDI;
  ulong uVar14;
  Data *pDVar15;
  Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_> *this_00;
  long in_FS_OFFSET;
  bool bVar16;
  Bucket BVar17;
  const_iterator it;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = in_RDI;
  this = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
         operator()(in_RDI);
  if (this != (Type *)0x0) {
    if ((this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
      LOCK();
      bVar16 = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
      if (bVar16) {
        (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
      }
      UNLOCK();
      if (!bVar16) goto LAB_003921e0;
    }
    else {
LAB_003921e0:
      QBasicMutex::lockInternal((QBasicMutex *)this);
    }
    pDVar15 = (this->dPointers).d;
    if ((pDVar15 == (Data *)0x0) || (pDVar15->size == 0)) {
LAB_0039225e:
      uVar9 = 0;
      pDVar15 = (Data *)0x0;
    }
    else {
      uVar9 = pDVar15->seed ^ (ulong)local_40;
      uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
      uVar9 = (uVar9 >> 0x20 ^ uVar9) * -0x2917014799a6026d;
      BVar17 = QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
               findBucketWithHash<void_const*>
                         ((Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)
                          pDVar15,&local_40,uVar9 >> 0x20 ^ uVar9);
      if ((BVar17.span)->offsets[BVar17.index] == 0xff) goto LAB_0039225e;
      uVar9 = ((ulong)((long)BVar17.span - (long)pDVar15->spans) >> 4) * 0x1c71c71c71c71c80 |
              BVar17.index;
    }
    if ((pDVar15 == (Data *)0x0) && (uVar9 == 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        internalSafetyCheckRemove();
        __clang_call_terminate(extraout_RAX);
      }
      goto LAB_00392585;
    }
    uVar10 = uVar9 >> 7;
    uVar9 = (ulong)((uint)uVar9 & 0x7f);
    it = QHash<void_const_volatile*,void_const*>::constFindImpl<void_const_volatile*>
                   ((QHash<void_const_volatile*,void_const*> *)&this->dataPointers,
                    (void **)(pDVar15->spans[uVar10].entries[pDVar15->spans[uVar10].offsets[uVar9]].
                              storage.data + 8));
    QHash<const_volatile_void_*,_const_void_*>::erase(&this->dataPointers,it);
    QHash<const_void_*,_(anonymous_namespace)::Data>::detach(&this->dPointers);
    pDVar15 = (this->dPointers).d;
    pSVar5 = pDVar15->spans;
    pSVar13 = pSVar5 + uVar10;
    bVar2 = pSVar13->offsets[uVar9];
    pSVar13->offsets[uVar9] = 0xff;
    pSVar5[uVar10].entries[bVar2].storage.data[0] = pSVar5[uVar10].nextFree;
    pSVar5[uVar10].nextFree = bVar2;
    pDVar15->size = pDVar15->size - 1;
    uVar10 = uVar9;
    this_00 = pSVar13;
    do {
      pSVar5 = pDVar15->spans;
      uVar10 = uVar10 + 1;
      if (uVar10 == 0x80) {
        pSVar13 = pSVar13 + 1;
        if (((long)pSVar13 - (long)pSVar5 >> 4) * -0x71c71c71c71c71c7 - (pDVar15->numBuckets >> 7)
            == 0) {
          pSVar13 = pSVar5;
        }
        uVar10 = 0;
      }
      bVar2 = pSVar13->offsets[uVar10];
      if (bVar2 != 0xff) {
        uVar14 = pDVar15->seed ^ *(ulong *)pSVar13->entries[bVar2].storage.data;
        uVar14 = (uVar14 >> 0x20 ^ uVar14) * -0x2917014799a6026d;
        uVar14 = (uVar14 >> 0x20 ^ uVar14) * -0x2917014799a6026d;
        uVar14 = pDVar15->numBuckets - 1 & (uVar14 >> 0x20 ^ uVar14);
        pSVar11 = pSVar5 + (uVar14 >> 7);
        uVar14 = (ulong)((uint)uVar14 & 0x7f);
        if ((uVar14 != uVar10) || (pSVar11 != pSVar13)) {
          do {
            if ((pSVar11 == this_00) && (uVar14 == uVar9)) {
              if (pSVar13 == this_00) {
                this_00->offsets[uVar9] = this_00->offsets[uVar10];
                this_00->offsets[uVar10] = 0xff;
                uVar9 = uVar10;
                this_00 = pSVar13;
              }
              else {
                if (this_00->nextFree == this_00->allocated) {
                  QHashPrivate::Span<QHashPrivate::Node<const_void_*,_(anonymous_namespace)::Data>_>
                  ::addStorage(this_00);
                }
                this_00->offsets[uVar9] = this_00->nextFree;
                pEVar6 = this_00->entries;
                bVar3 = this_00->nextFree;
                this_00->nextFree = pEVar6[bVar3].storage.data[0];
                bVar4 = pSVar13->offsets[uVar10];
                pSVar13->offsets[uVar10] = 0xff;
                pEVar7 = pSVar13->entries;
                pEVar1 = pEVar7 + bVar4;
                uVar8 = *(undefined8 *)((pEVar1->storage).data + 8);
                pEVar6 = pEVar6 + bVar3;
                *(undefined8 *)(pEVar6->storage).data = *(undefined8 *)(pEVar1->storage).data;
                *(undefined8 *)((pEVar6->storage).data + 8) = uVar8;
                pEVar7[bVar4].storage.data[0] = pSVar13->nextFree;
                pSVar13->nextFree = bVar4;
                uVar9 = uVar10;
                this_00 = pSVar13;
              }
              break;
            }
            uVar14 = uVar14 + 1;
            if (uVar14 == 0x80) {
              pSVar12 = pSVar11 + 1;
              pSVar11 = pSVar5;
              if (((long)pSVar12 - (long)pSVar5 >> 4) * -0x71c71c71c71c71c7 -
                  (pDVar15->numBuckets >> 7) != 0) {
                pSVar11 = pSVar12;
              }
              uVar14 = 0;
            }
          } while ((uVar14 != uVar10) || (pSVar11 != pSVar13));
        }
      }
    } while (bVar2 != 0xff);
    LOCK();
    copy = (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
    (this->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if (copy != (__pointer_type)0x1) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QBasicMutex::unlockInternalFutex((QBasicMutex *)this,copy);
        return;
      }
      goto LAB_00392585;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00392585:
  __stack_chk_fail();
}

Assistant:

void QtSharedPointer::internalSafetyCheckRemove(const void *d_ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    QMutexLocker lock(&kp->mutex);

    const auto it = kp->dPointers.constFind(d_ptr);
    if (Q_UNLIKELY(it == kp->dPointers.cend())) {
        qFatal("QSharedPointer: internal self-check inconsistency: pointer %p was not tracked. "
               "To use QT_SHAREDPOINTER_TRACK_POINTERS, you have to enable it throughout "
               "in your code.", d_ptr);
    }

    const auto it2 = kp->dataPointers.constFind(it->pointer);
    Q_ASSERT(it2 != kp->dataPointers.cend());

    //qDebug("Removing d=%p value=%p", d_ptr, it->pointer);

    // remove entries
    kp->dataPointers.erase(it2);
    kp->dPointers.erase(it);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}